

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O3

void Fra_OneHotEstimateCoverage(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  uint *puVar1;
  void *__s;
  int *piVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  void *__ptr;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int iVar14;
  int iVar15;
  undefined1 auVar13 [16];
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar20;
  uint uVar21;
  timespec ts;
  timespec local_48;
  ulong local_38;
  
  uVar19 = p->pManAig->nRegs;
  lVar12 = (long)(int)uVar19;
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  uVar6 = lVar12 + 1;
  __ptr = malloc(uVar6 * 0x10000 + lVar12 * 8 + 8);
  auVar3 = _DAT_0093d220;
  if ((int)uVar19 < 0) {
    Aig_ManRandom(1);
  }
  else {
    lVar11 = lVar12 * 8 + 8;
    lVar8 = (uVar6 & 0xffffffff) - 1;
    auVar13._8_4_ = (int)lVar8;
    auVar13._0_8_ = lVar8;
    auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar13 = auVar13 ^ _DAT_0093d220;
    auVar17 = _DAT_0093d210;
    do {
      auVar18 = auVar17 ^ auVar3;
      lVar9 = auVar17._8_8_;
      if ((bool)(~(auVar18._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar18._0_4_ ||
                  auVar13._4_4_ < auVar18._4_4_) & 1)) {
        *(long *)((long)__ptr + lVar8) = (long)__ptr + auVar17._0_8_ * 0x10000 + lVar11;
      }
      if ((auVar18._12_4_ != auVar13._12_4_ || auVar18._8_4_ <= auVar13._8_4_) &&
          auVar18._12_4_ <= auVar13._12_4_) {
        *(long *)((long)__ptr + lVar8 + 8) =
             (long)__ptr + CONCAT44(auVar17._10_4_,(int)(lVar9 << 0x10)) + lVar11;
      }
      auVar17._0_8_ = auVar17._0_8_ + 2;
      auVar17._8_8_ = lVar9 + 2;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)((int)uVar6 + 1U >> 1) << 4 != lVar8);
    local_38 = uVar6;
    Aig_ManRandom(1);
    if (uVar19 != 0) {
      lVar11 = 0;
      do {
        lVar8 = *(long *)((long)__ptr + lVar11 * 8);
        lVar9 = 0;
        do {
          uVar5 = Aig_ManRandom(0);
          *(uint *)(lVar8 + lVar9 * 4) = uVar5;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x4000);
        lVar11 = lVar11 + 1;
      } while (lVar11 != lVar12);
    }
    if (-1 < (int)uVar19) {
      __s = *(void **)((long)__ptr + lVar12 * 8);
      memset(__s,0,0x10000);
      iVar4 = vOneHots->nSize;
      if (0 < iVar4) {
        piVar2 = vOneHots->pArray;
        uVar6 = 0;
        do {
          if ((long)iVar4 <= (long)(uVar6 | 1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar5 = piVar2[uVar6];
          uVar20 = piVar2[uVar6 | 1];
          if (uVar5 != 0 || uVar20 != 0) {
            uVar21 = ~uVar5;
            if (0 < (int)uVar5) {
              uVar21 = uVar5 - 1;
            }
            if (uVar19 < uVar21) goto LAB_009100e3;
            uVar10 = ~uVar20;
            if (0 < (int)uVar20) {
              uVar10 = uVar20 - 1;
            }
            if (((int)uVar10 < 0) || ((uint)local_38 <= uVar10)) goto LAB_009100e3;
            lVar12 = *(long *)((long)__ptr + (ulong)uVar21 * 8);
            lVar11 = *(long *)((long)__ptr + (ulong)uVar10 * 8);
            if ((int)uVar5 < 0) {
              if ((int)uVar20 < 0) {
                lVar8 = 0;
                do {
                  puVar1 = (uint *)((long)__s + lVar8 * 4);
                  *puVar1 = *puVar1 | *(uint *)(lVar11 + lVar8 * 4) & *(uint *)(lVar12 + lVar8 * 4);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 0x4000);
              }
              else {
                lVar8 = 0;
                do {
                  puVar1 = (uint *)((long)__s + lVar8 * 4);
                  *puVar1 = *puVar1 | ~*(uint *)(lVar11 + lVar8 * 4) & *(uint *)(lVar12 + lVar8 * 4)
                  ;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 0x4000);
              }
            }
            else {
              if (-1 < (int)uVar20) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraHot.c"
                              ,0x175,"void Fra_OneHotEstimateCoverage(Fra_Man_t *, Vec_Int_t *)");
              }
              lVar8 = 0;
              do {
                puVar1 = (uint *)((long)__s + lVar8 * 4);
                *puVar1 = *puVar1 | ~*(uint *)(lVar12 + lVar8 * 4) & *(uint *)(lVar11 + lVar8 * 4);
                lVar8 = lVar8 + 1;
              } while (lVar8 != 0x4000);
            }
          }
          uVar6 = uVar6 + 2;
          iVar4 = vOneHots->nSize;
        } while ((int)uVar6 < iVar4);
      }
      iVar4 = 0;
      iVar14 = 0;
      iVar15 = 0;
      iVar16 = 0;
      lVar12 = 0;
      do {
        puVar1 = (uint *)((long)__s + lVar12 * 4);
        uVar19 = (*puVar1 >> 1 & 0x55555555) + (*puVar1 & 0x55555555);
        uVar5 = (puVar1[1] >> 1 & 0x55555555) + (puVar1[1] & 0x55555555);
        uVar20 = (puVar1[2] >> 1 & 0x55555555) + (puVar1[2] & 0x55555555);
        uVar21 = (puVar1[3] >> 1 & 0x55555555) + (puVar1[3] & 0x55555555);
        uVar19 = (uVar19 >> 2 & 0x33333333) + (uVar19 & 0x33333333);
        uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
        uVar20 = (uVar20 >> 2 & 0x33333333) + (uVar20 & 0x33333333);
        uVar21 = (uVar21 >> 2 & 0x33333333) + (uVar21 & 0x33333333);
        uVar19 = (uVar19 >> 4 & 0x7070707) + (uVar19 & 0x7070707);
        uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
        uVar20 = (uVar20 >> 4 & 0x7070707) + (uVar20 & 0x7070707);
        uVar21 = (uVar21 >> 4 & 0x7070707) + (uVar21 & 0x7070707);
        uVar19 = (uVar19 >> 8 & 0xf000f) + (uVar19 & 0xf000f);
        uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
        uVar20 = (uVar20 >> 8 & 0xf000f) + (uVar20 & 0xf000f);
        uVar21 = (uVar21 >> 8 & 0xf000f) + (uVar21 & 0xf000f);
        iVar4 = iVar4 + (uVar19 >> 0x10) + (uVar19 & 0x1f);
        iVar14 = iVar14 + (uVar5 >> 0x10) + (uVar5 & 0x1f);
        iVar15 = iVar15 + (uVar20 >> 0x10) + (uVar20 & 0x1f);
        iVar16 = iVar16 + (uVar21 >> 0x10) + (uVar21 & 0x1f);
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x4000);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      uVar19 = 0x80000 - (iVar16 + iVar14 + iVar15 + iVar4);
      printf("Care states ratio = %f. ",(double)(int)uVar19 * 1.9073486328125e-06);
      iVar4 = 0xa1bf40;
      printf("(%d out of %d patterns)  ",(ulong)uVar19,0x80000);
      Abc_Print(iVar4,"%s =","Time");
      iVar14 = 3;
      iVar4 = clock_gettime(3,&local_48);
      if (iVar4 < 0) {
        lVar12 = -1;
      }
      else {
        lVar12 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar12 + lVar7) / 1000000.0);
      return;
    }
  }
LAB_009100e3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Fra_OneHotEstimateCoverage( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    int nSimWords = (1<<14);
    int nRegs = Aig_ManRegNum(p->pManAig);
    Vec_Ptr_t * vSimInfo;
    unsigned * pSim1, * pSim2, * pSimTot;
    int i, w, Out1, Out2, nCovered, Counter = 0;
    abctime clk = Abc_Clock();

    // generate random sim-info at register outputs
    vSimInfo = Vec_PtrAllocSimInfo( nRegs + 1, nSimWords );
//    srand( 0xAABBAABB );
    Aig_ManRandom(1);
    for ( i = 0; i < nRegs; i++ )
    {
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, i );
        for ( w = 0; w < nSimWords; w++ )
            pSim1[w] = Fra_ObjRandomSim();
    }
    pSimTot = (unsigned *)Vec_PtrEntry( vSimInfo, nRegs );

    // collect simulation info
    memset( pSimTot, 0, sizeof(unsigned) * nSimWords );
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
//printf( "(%c%d,%c%d) ", 
//Fra_LitSign(Out1)? '-': '+', Fra_LitReg(Out1), 
//Fra_LitSign(Out2)? '-': '+', Fra_LitReg(Out2) ); 
        Counter++;
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, Fra_LitReg(Out1) );
        pSim2 = (unsigned *)Vec_PtrEntry( vSimInfo, Fra_LitReg(Out2) );
        if ( Fra_LitSign(Out1) && Fra_LitSign(Out2) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |=  pSim1[w] &  pSim2[w];
        else if ( Fra_LitSign(Out1) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |=  pSim1[w] & ~pSim2[w];
        else if ( Fra_LitSign(Out2) )
            for ( w = 0; w < nSimWords; w++ )
                pSimTot[w] |= ~pSim1[w] &  pSim2[w];
        else
            assert( 0 );
    }
//printf( "\n" );
    // count the total number of patterns contained in the don't-care
    nCovered = 0;
    for ( w = 0; w < nSimWords; w++ )
        nCovered += Aig_WordCountOnes( pSimTot[w] );
    Vec_PtrFree( vSimInfo );
    // print the result
    printf( "Care states ratio = %f. ", 1.0 * (nSimWords * 32 - nCovered) / (nSimWords * 32) );
    printf( "(%d out of %d patterns)  ", nSimWords * 32 - nCovered, nSimWords * 32 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}